

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

Matrix * TRM::lookAt(Matrix *__return_storage_ptr__,Vec3f eye,Vec3f center,Vec3f up)

{
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar1;
  float fVar2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar3;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  aVar4 = eye.field_2;
  aVar1 = eye.field_0;
  aVar3 = eye.field_1;
  fVar5 = center.field_0.x - aVar1.x;
  fVar6 = center.field_1.y - aVar3.y;
  fVar7 = center.field_2.z - aVar4.z;
  fVar2 = fVar7 * fVar7 + fVar6 * fVar6 + fVar5 * fVar5;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = 1.0 / fVar2;
  fVar5 = fVar5 * fVar2;
  fVar6 = fVar6 * fVar2;
  fVar7 = fVar7 * fVar2;
  fVar11 = fVar6 * up.field_2.z - fVar7 * up.field_1.y;
  fVar12 = fVar7 * up.field_0.x - up.field_2.z * fVar5;
  fVar9 = up.field_1.y * fVar5 - fVar6 * up.field_0.x;
  fVar2 = fVar9 * fVar9 + fVar12 * fVar12 + fVar11 * fVar11;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = 1.0 / fVar2;
  fVar11 = fVar11 * fVar2;
  fVar12 = fVar12 * fVar2;
  fVar2 = fVar2 * fVar9;
  fVar9 = fVar12 * fVar7 - fVar2 * fVar6;
  fVar10 = fVar2 * fVar5 - fVar11 * fVar7;
  fVar8 = fVar11 * fVar6 - fVar12 * fVar5;
  __return_storage_ptr__->value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  __return_storage_ptr__->value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  __return_storage_ptr__->value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  __return_storage_ptr__->value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  __return_storage_ptr__->value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  __return_storage_ptr__->value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  __return_storage_ptr__->value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  __return_storage_ptr__->value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  __return_storage_ptr__->value[3].field_3.w = 1.0;
  __return_storage_ptr__->value[0].field_0.x = fVar11;
  __return_storage_ptr__->value[1].field_0.x = fVar12;
  __return_storage_ptr__->value[2].field_0.x = fVar2;
  __return_storage_ptr__->value[0].field_1.y = fVar9;
  __return_storage_ptr__->value[1].field_1.y = fVar10;
  __return_storage_ptr__->value[2].field_1.y = fVar8;
  __return_storage_ptr__->value[0].field_2.z = -fVar5;
  __return_storage_ptr__->value[1].field_2.z = -fVar6;
  __return_storage_ptr__->value[2].field_2.z = -fVar7;
  __return_storage_ptr__->value[3].field_0.x =
       -(fVar2 * aVar4.z + fVar12 * aVar3.y + fVar11 * aVar1.x);
  __return_storage_ptr__->value[3].field_1.y =
       -(fVar8 * aVar4.z + fVar10 * aVar3.y + fVar9 * aVar1.x);
  __return_storage_ptr__->value[3].field_2.z = fVar7 * aVar4.z + aVar3.y * fVar6 + aVar1.x * fVar5;
  return __return_storage_ptr__;
}

Assistant:

Matrix lookAt(Vec3f eye, Vec3f center, Vec3f up) {
  return glm::lookAt(eye, center, up);
}